

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

int libssh2_sftp_mkdir_ex(LIBSSH2_SFTP *sftp,char *path,uint path_len,long mode)

{
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar1;
  uint32_t uVar2;
  int iVar3;
  uchar *buf;
  ssize_t sVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  uchar *s;
  size_t data_len;
  LIBSSH2_SFTP_ATTRIBUTES attrs;
  uchar *local_a8;
  uchar *local_a0;
  int local_94;
  size_t local_90;
  ulong local_88;
  char *local_80;
  ulong local_78;
  time_t local_70;
  LIBSSH2_SFTP_ATTRIBUTES local_68;
  ulong buflen;
  
  if (sftp == (LIBSSH2_SFTP *)0x0) {
    iVar3 = -0x27;
  }
  else {
    local_80 = path;
    local_70 = time((time_t *)0x0);
    local_78 = mode | 0x4000;
    local_88 = (ulong)path_len;
    local_94 = path_len + 0x11;
    do {
      channel = sftp->channel;
      pLVar1 = channel->session;
      local_68.mtime = 0;
      local_68.permissions = 0;
      local_68.atime = 0;
      local_68.uid = 0;
      local_68.gid = 0;
      local_68.flags = 0;
      local_68.filesize = 0;
      local_90 = 0;
      local_a0 = (uchar *)0x0;
      iVar3 = 0;
      if (mode != -1) {
        local_68.flags = 4;
        local_68.permissions = local_78;
        iVar3 = 4;
      }
      uVar7 = iVar3 + local_94;
      buflen = (ulong)uVar7;
      if (sftp->mkdir_state == libssh2_NB_state_idle) {
        sftp->last_errno = 0;
        buf = (uchar *)(*pLVar1->alloc)(buflen,&pLVar1->abstract);
        if (buf != (uchar *)0x0) {
          local_a8 = buf;
          _libssh2_store_u32(&local_a8,uVar7 - 4);
          *local_a8 = '\x0e';
          uVar2 = sftp->request_id;
          sftp->request_id = uVar2 + 1;
          sftp->mkdir_request_id = uVar2;
          local_a8 = local_a8 + 1;
          _libssh2_store_u32(&local_a8,uVar2);
          _libssh2_store_str(&local_a8,local_80,local_88);
          sVar4 = sftp_attr2bin(local_a8,&local_68);
          local_a8 = local_a8 + sVar4;
          sftp->mkdir_state = libssh2_NB_state_created;
          goto LAB_00127677;
        }
        iVar3 = -6;
        pcVar6 = "Unable to allocate memory for FXP_MKDIR packet";
        local_a8 = (uchar *)0x0;
LAB_001277a0:
        iVar3 = _libssh2_error(pLVar1,iVar3,pcVar6);
LAB_001277c8:
        if (iVar3 != -0x25) {
          return iVar3;
        }
      }
      else {
        if (sftp->mkdir_state != libssh2_NB_state_created) {
LAB_001276cf:
          iVar3 = sftp_packet_require(sftp,'e',sftp->mkdir_request_id,&local_a0,&local_90,9);
          if (iVar3 == 0) {
            sftp->mkdir_state = libssh2_NB_state_idle;
            uVar2 = _libssh2_ntohu32(local_a0 + 5);
            (*pLVar1->free)(local_a0,&pLVar1->abstract);
            if (uVar2 == 0) {
              return 0;
            }
            sftp->last_errno = uVar2;
            iVar3 = -0x1f;
            pcVar6 = "SFTP Protocol Error";
            goto LAB_001277a0;
          }
          if (iVar3 == -0x25) goto LAB_001277cd;
          if (iVar3 == -0x26) {
            if (local_90 != 0) {
              (*pLVar1->free)(local_a0,&pLVar1->abstract);
            }
            iVar3 = -0x1f;
            pcVar6 = "SFTP mkdir packet too short";
          }
          else {
            sftp->mkdir_state = libssh2_NB_state_idle;
            pcVar6 = "Error waiting for FXP STATUS";
          }
          iVar3 = _libssh2_error(pLVar1,iVar3,pcVar6);
          goto LAB_001277c8;
        }
        buf = sftp->mkdir_packet;
LAB_00127677:
        uVar5 = _libssh2_channel_write(channel,0,buf,buflen);
        if (uVar5 != 0xffffffffffffffdb) {
          (*pLVar1->free)(buf,&pLVar1->abstract);
          if (uVar5 != buflen) {
            sftp->mkdir_state = libssh2_NB_state_idle;
            iVar3 = -7;
            pcVar6 = "_libssh2_channel_write() failed";
            goto LAB_001277a0;
          }
          sftp->mkdir_state = libssh2_NB_state_sent;
          sftp->mkdir_packet = (uchar *)0x0;
          goto LAB_001276cf;
        }
        sftp->mkdir_packet = buf;
      }
LAB_001277cd:
      pLVar1 = sftp->channel->session;
      if (pLVar1->api_block_mode == 0) {
        return -0x25;
      }
      iVar3 = _libssh2_wait_socket(pLVar1,local_70);
    } while (iVar3 == 0);
  }
  return iVar3;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_mkdir_ex(LIBSSH2_SFTP *sftp, const char *path,
                      unsigned int path_len, long mode)
{
    int rc;
    if(!sftp)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, sftp->channel->session,
                 sftp_mkdir(sftp, path, path_len, mode));
    return rc;
}